

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O1

string * __thiscall
FileSystemUtils::Path::Extension_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  long *local_48 [2];
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar3 = (char)&this->m_string;
  uVar1 = std::__cxx11::string::rfind(cVar3,0x2e);
  if (uVar1 != 0xffffffffffffffff) {
    uVar2 = std::__cxx11::string::rfind(cVar3,0x2f);
    if (uVar2 == 0xffffffffffffffff || uVar2 <= uVar1) {
      uVar2 = std::__cxx11::string::rfind(cVar3,0x5c);
      if (uVar2 == 0xffffffffffffffff || uVar2 <= uVar1) {
        uVar1 = std::__cxx11::string::rfind(cVar3,0x2e);
        if (uVar1 < (this->m_string)._M_string_length) {
          std::__cxx11::string::substr((ulong)local_48,(ulong)&this->m_string);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
          if (local_48[0] != local_38) {
            operator_delete(local_48[0],local_38[0] + 1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Path::Extension()			const
	{
		std::string ext;
		if( HasExtension() )
		{
			size_t pos = m_string.find_last_of( '.' );
			if( pos < m_string.length() )
			{
				ext = m_string.substr( pos );
			}
		}
		return ext;
	}